

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cobs.h
# Opt level: O1

size_t cobs_encode(uint8_t *input,size_t length,uint8_t *output)

{
  size_t sVar1;
  uint8_t uVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  
  if (length == 0) {
    uVar2 = '\x01';
    sVar5 = 1;
    sVar3 = 0;
  }
  else {
    uVar2 = '\x01';
    sVar3 = 0;
    sVar6 = 0;
    sVar4 = 1;
    do {
      if (input[sVar6] == '\0') {
        lVar7 = 1;
        sVar1 = sVar4;
LAB_001013e4:
        output[sVar3] = uVar2;
        sVar5 = sVar4 + lVar7;
        uVar2 = '\x01';
        sVar3 = sVar1;
      }
      else {
        sVar5 = sVar4 + 1;
        output[sVar4] = input[sVar6];
        uVar2 = uVar2 + '\x01';
        if (uVar2 == 0xff) {
          lVar7 = 2;
          sVar1 = sVar5;
          goto LAB_001013e4;
        }
      }
      sVar6 = sVar6 + 1;
      sVar4 = sVar5;
    } while (length != sVar6);
  }
  output[sVar3] = uVar2;
  return sVar5;
}

Assistant:

size_t cobs_encode(const uint8_t *  input, size_t length, uint8_t *  output)
{
  size_t read_index = 0;
  size_t write_index = 1;
  size_t code_index = 0;
  uint8_t code = 1;

  while(read_index < length)
  {
    if(input[read_index] == 0)
    {
      output[code_index] = code;
      code = 1;
      code_index = write_index++;
      read_index++;
    }
    else
    {
      output[write_index++] = input[read_index++];
      code++;

      if(code == 0xFF)
      {
        output[code_index] = code;
        code = 1;
        code_index = write_index++;
      }
    }
  }

  output[code_index] = code;

  return write_index;
}